

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O1

bool __thiscall FBX::Decoder::readNode(Decoder *this,Node *node)

{
  Stream *this_00;
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  char cVar4;
  pointer __s2;
  int iVar5;
  size_t sVar6;
  long lVar7;
  size_t sVar8;
  runtime_error *this_01;
  size_t __n;
  ulong uVar9;
  vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
  *this_02;
  long lVar10;
  Node child;
  allocator_type local_a9;
  ulong local_a8;
  int local_9c;
  undefined1 local_98 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  vector<FBX::Node,_std::allocator<FBX::Node>_> local_68;
  vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
  vStack_50;
  vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
  *local_38;
  
  bVar2 = this->isuInt32;
  sVar8 = (this->stream).cursor;
  if (bVar2 == true) {
    sVar6 = sVar8 + 4;
  }
  else {
    sVar6 = sVar8 + 8;
  }
  (this->stream).cursor = sVar6;
  iVar5 = *(int *)((this->stream).data + sVar8);
  local_9c = iVar5;
  if (iVar5 != 0) {
    sVar8 = (this->stream).cursor;
    if (bVar2 == false) {
      sVar6 = sVar8 + 8;
    }
    else {
      sVar6 = sVar8 + 4;
    }
    (this->stream).cursor = sVar6;
    node->propertyCount = (long)*(int *)((this->stream).data + sVar8);
    sVar8 = (this->stream).cursor;
    if (bVar2 == false) {
      sVar6 = sVar8 + 8;
    }
    else {
      sVar6 = sVar8 + 4;
    }
    (this->stream).cursor = sVar6;
    node->propertyLength = (long)*(int *)((this->stream).data + sVar8);
    sVar8 = (this->stream).cursor;
    (this->stream).cursor = sVar8 + 1;
    pcVar1 = (this->stream).data + sVar8 + 1;
    bVar3 = pcVar1[-1];
    (this->stream).cursor = sVar8 + 1 + (ulong)bVar3;
    local_98._0_8_ = local_98 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_98,pcVar1,pcVar1 + bVar3);
    std::__cxx11::string::operator=((string *)&node->id,(string *)local_98);
    if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
      operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
    }
    local_a8 = (ulong)iVar5;
    this_02 = &node->properties;
    std::
    vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
    ::resize(this_02,node->propertyCount);
    if (node->propertyCount != 0) {
      lVar10 = 0;
      uVar9 = 0;
      local_38 = this_02;
      do {
        pcVar1 = (this->stream).data;
        sVar8 = (this->stream).cursor;
        (this->stream).cursor = sVar8 + 1;
        cVar4 = pcVar1[sVar8];
        switch(cVar4) {
        case 'C':
          (this->stream).cursor = sVar8 + 2;
          local_98[0] = pcVar1[sVar8 + 1];
          std::
          variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
          ::operator=((variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                       *)((long)&(((this_02->
                                   super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super__Variant_base<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>
                                 ).
                                 super__Move_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                                 .
                                 super__Copy_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                         + lVar10),(bool *)local_98);
          break;
        case 'D':
          (this->stream).cursor = sVar8 + 9;
          local_98._0_8_ = *(undefined8 *)(pcVar1 + sVar8 + 1);
          std::
          variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
          ::operator=((variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                       *)((long)&(((this_02->
                                   super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super__Variant_base<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>
                                 ).
                                 super__Move_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                                 .
                                 super__Copy_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                         + lVar10),(double *)local_98);
          break;
        case 'E':
        case 'G':
        case 'H':
        case 'J':
        case 'K':
        case 'M':
        case 'N':
        case 'O':
        case 'P':
        case 'Q':
          break;
        case 'F':
          (this->stream).cursor = sVar8 + 5;
          local_98._0_4_ = *(undefined4 *)(pcVar1 + sVar8 + 1);
          std::
          variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
          ::operator=((variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                       *)((long)&(((this_02->
                                   super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super__Variant_base<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>
                                 ).
                                 super__Move_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                                 .
                                 super__Copy_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                         + lVar10),(float *)local_98);
          break;
        case 'I':
          (this->stream).cursor = sVar8 + 5;
          local_98._0_4_ = *(undefined4 *)(pcVar1 + sVar8 + 1);
          std::
          variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
          ::operator=((variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                       *)((long)&(((this_02->
                                   super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super__Variant_base<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>
                                 ).
                                 super__Move_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                                 .
                                 super__Copy_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                         + lVar10),(int *)local_98);
          break;
        case 'L':
          (this->stream).cursor = sVar8 + 9;
          local_98._0_8_ = *(undefined8 *)(pcVar1 + sVar8 + 1);
          std::
          variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
          ::operator=((variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                       *)((long)&(((this_02->
                                   super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super__Variant_base<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>
                                 ).
                                 super__Move_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                                 .
                                 super__Copy_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                         + lVar10),(long *)local_98);
          break;
        case 'R':
          sVar8 = (this->stream).cursor;
          if (this->isuInt32 == true) {
            sVar6 = sVar8 + 4;
          }
          else {
            sVar6 = sVar8 + 8;
          }
          (this->stream).cursor = sVar6;
          lVar7 = (long)*(int *)((this->stream).data + sVar8);
          sVar8 = (this->stream).cursor;
          (this->stream).cursor = sVar8 + lVar7;
          std::vector<char,std::allocator<char>>::vector<char_const*,void>
                    ((vector<char,std::allocator<char>> *)local_98,pcVar1 + sVar8,
                     pcVar1 + sVar8 + lVar7,&local_a9);
LAB_00104aee:
          std::
          variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
          ::operator=((variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                       *)((long)&(((this_02->
                                   super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super__Variant_base<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>
                                 ).
                                 super__Move_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                                 .
                                 super__Copy_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                         + lVar10),(vector<char,_std::allocator<char>_> *)local_98);
          goto LAB_00104afd;
        case 'S':
          sVar8 = (this->stream).cursor;
          if (this->isuInt32 == true) {
            sVar6 = sVar8 + 4;
          }
          else {
            sVar6 = sVar8 + 8;
          }
          (this->stream).cursor = sVar6;
          lVar7 = (long)*(int *)((this->stream).data + sVar8);
          sVar8 = (this->stream).cursor;
          (this->stream).cursor = sVar8 + lVar7;
          local_98._0_8_ = local_98 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_98,pcVar1 + sVar8,pcVar1 + sVar8 + lVar7);
          std::
          variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
          ::operator=((variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                       *)((long)&(((local_38->
                                   super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super__Variant_base<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>
                                 ).
                                 super__Move_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                                 .
                                 super__Copy_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                         + lVar10),
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98)
          ;
          this_02 = local_38;
          if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
            operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
            this_02 = local_38;
          }
          break;
        default:
          switch(cVar4) {
          case 'b':
          case 'c':
            readArray<char>((vector<char,_std::allocator<char>_> *)local_98,this);
            goto LAB_00104aee;
          case 'd':
            readArray<double>((vector<double,_std::allocator<double>_> *)local_98,this);
            std::
            variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
            ::operator=((variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                         *)((long)&(((this_02->
                                     super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->
                                   super__Variant_base<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>
                                   ).
                                   super__Move_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                                   .
                                   super__Copy_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                           + lVar10),(vector<double,_std::allocator<double>_> *)local_98);
            break;
          case 'e':
          case 'g':
          case 'h':
          case 'j':
          case 'k':
            goto switchD_00104881_caseD_45;
          case 'f':
            readArray<float>((vector<float,_std::allocator<float>_> *)local_98,this);
            std::
            variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
            ::operator=((variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                         *)((long)&(((this_02->
                                     super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->
                                   super__Variant_base<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>
                                   ).
                                   super__Move_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                                   .
                                   super__Copy_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                           + lVar10),(vector<float,_std::allocator<float>_> *)local_98);
            break;
          case 'i':
            readArray<int>((vector<int,_std::allocator<int>_> *)local_98,this);
            std::
            variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
            ::operator=((variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                         *)((long)&(((this_02->
                                     super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->
                                   super__Variant_base<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>
                                   ).
                                   super__Move_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                                   .
                                   super__Copy_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                           + lVar10),(vector<int,_std::allocator<int>_> *)local_98);
            break;
          case 'l':
            readArray<long>((vector<long,_std::allocator<long>_> *)local_98,this);
            std::
            variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
            ::operator=((variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                         *)((long)&(((this_02->
                                     super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->
                                   super__Variant_base<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>
                                   ).
                                   super__Move_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                                   .
                                   super__Copy_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                           + lVar10),(vector<long,_std::allocator<long>_> *)local_98);
            break;
          default:
            if (cVar4 == 'Y') {
              (this->stream).cursor = sVar8 + 3;
              local_98._0_2_ = *(undefined2 *)(pcVar1 + sVar8 + 1);
              std::
              variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
              ::operator=((variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                           *)((long)&(((this_02->
                                       super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->
                                     super__Variant_base<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>
                                     ).
                                     super__Move_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                                     .
                                     super__Copy_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                             + lVar10),(short *)local_98);
            }
            goto switchD_00104881_caseD_45;
          }
LAB_00104afd:
          if ((pointer)local_98._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_98._0_8_,local_98._16_8_ - local_98._0_8_);
          }
        }
switchD_00104881_caseD_45:
        uVar9 = uVar9 + 1;
        lVar10 = lVar10 + 0x30;
      } while (uVar9 < node->propertyCount);
    }
    this_00 = &this->stream;
    sVar8 = Stream::tell(this_00);
    if (sVar8 < local_a8) {
      sVar8 = Stream::tell(this_00);
      __n = this->blockLength;
      if (sVar8 < local_a8 - __n) {
        do {
          local_98._0_8_ = (pointer)0x0;
          local_98._8_8_ = 0;
          local_98._24_8_ = 0;
          local_78._M_local_buf[0] = '\0';
          vStack_50.
          super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          vStack_50.
          super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_68.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          vStack_50.
          super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_68.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_68.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_98._16_8_ = &local_78;
          readNode(this,(Node *)local_98);
          std::vector<FBX::Node,_std::allocator<FBX::Node>_>::push_back
                    (&node->children,(Node *)local_98);
          std::
          vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
          ::~vector(&vStack_50);
          std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector(&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._16_8_ != &local_78) {
            operator_delete((void *)local_98._16_8_,
                            CONCAT71(local_78._M_allocated_capacity._1_7_,local_78._M_local_buf[0])
                            + 1);
          }
          sVar8 = Stream::tell(this_00);
          __n = this->blockLength;
        } while (sVar8 < local_a8 - __n);
      }
      sVar8 = (this->stream).cursor;
      __s2 = (this->blockData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
      (this->stream).cursor = sVar8 + __n;
      if ((__n != (long)(this->blockData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)__s2) ||
         ((__n != 0 && (iVar5 = bcmp((this->stream).data + sVar8,__s2,__n), iVar5 != 0)))) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"Failed to read nested block");
        goto LAB_00104c87;
      }
    }
    sVar8 = Stream::tell(this_00);
    if (sVar8 < local_a8) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,"Scope length not reached");
LAB_00104c87:
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return local_9c != 0;
}

Assistant:

bool Decoder::readNode(Node &node) {
        size_t endOffset = readuInt();
        if (endOffset == 0)
            return false;

        node.propertyCount = readuInt();
        node.propertyLength = readuInt();

        node.id = readString();
        node.properties.resize(node.propertyCount);

        for (size_t i = 0; i < node.propertyCount; i++) {
            auto dataType = stream.read<char>();
            switch (dataType) {
                case 'Y':
                    node.properties[i] = stream.read<int16_t>(); /// 16 bit int
                    break;
                case 'C':
                    node.properties[i] = stream.read<bool>(); /// 1 bit bool
                    break;
                case 'I':
                    node.properties[i] = stream.read<int32_t>(); /// 32 bit int
                    break;
                case 'F':
                    node.properties[i] = stream.read<float>(); /// 32 bit float
                    break;
                case 'D':
                    node.properties[i] = stream.read<double>(); /// 64 bit float (double)
                    break;
                case 'L':
                    node.properties[i] = stream.read<int64_t>(); /// 64 bit int
                    break;
                case 'R': {
                    const auto &data = stream.read<char>(readuInt());
                    node.properties[i] = std::vector<char>(data.begin, data.end); /// binary data
                    break;
                }
                case 'S': {
                    const auto &data = stream.read<char>(readuInt());
                    node.properties[i] = std::string(data.begin, data.end); /// string
                    break;
                }
                case 'f':
                    node.properties[i] = readArray<float>(); /// array of 32 bit float
                    break;
                case 'i':
                    node.properties[i] = readArray<int32_t>(); /// array of 32 bit int
                    break;
                case 'd':
                    node.properties[i] = readArray<double>(); /// array of 64 bit float (double)
                    break;
                case 'l':
                    node.properties[i] = readArray<int64_t>(); /// array of 64 bit int
                    break;
                case 'b':
                    node.properties[i] = readArray<char>(); /// array of 1 bit boolean
                    break;
                case 'c':
                    node.properties[i] = readArray<char>(); /// array of bytes
                    break;
                default:
                    break;
            }
        }

        if (stream.tell() < endOffset) {
            while (stream.tell() < (endOffset - blockLength)) {
                Node child;
                readNode(child);
                node.children.push_back(child);
            }

            if (stream.read<char>(blockLength) != Span<char>(blockData.data(), blockData.size()))
                throw std::runtime_error("Failed to read nested block");
        }

        if (stream.tell() < endOffset)
            throw std::runtime_error("Scope length not reached");

        return true;
    }